

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainstate.cpp
# Opt level: O1

ChainstateLoadResult *
node::VerifyLoadedChainstate
          (ChainstateLoadResult *__return_storage_ptr__,ChainstateManager *chainman,
          ChainstateLoadOptions *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  Chainstate *this;
  pointer ppCVar4;
  CChainParams *consensus_params;
  VerifyDBResult VVar5;
  CCoinsViewCache *pCVar6;
  uchar *puVar7;
  CBlockIndex *pCVar8;
  int64_t iVar9;
  unique_ptr<CoinsViews,_std::default_delete<CoinsViews>_> *puVar10;
  ulong uVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock8;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> local_a8;
  char *local_90;
  unique_lock<std::recursive_mutex> local_88;
  bilingual_str local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88._M_device = &cs_main.super_recursive_mutex;
  local_88._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_88);
  ChainstateManager::GetAll(&local_a8,chainman);
  if (local_a8.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_a8.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    do {
      if (options->wipe_chainstate_db == false) {
        this = (Chainstate *)paVar12->_M_allocated_capacity;
        pCVar6 = Chainstate::CoinsTip(this);
        (*(pCVar6->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[2])(&local_78,pCVar6);
        puVar7 = std::
                 __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                           (&local_78,&local_78.translated);
        if ((string *)puVar7 != &local_78.translated) {
          ppCVar4 = (this->m_chain).vChain.
                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if (ppCVar4 ==
              (this->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_start) {
            pCVar8 = (CBlockIndex *)0x0;
          }
          else {
            pCVar8 = ppCVar4[-1];
          }
          if ((pCVar8 != (CBlockIndex *)0x0) &&
             (uVar3 = pCVar8->nTime, iVar9 = GetTime(), iVar9 + 0x1c20 < (long)(ulong)uVar3)) {
            paVar12 = &local_78.original.field_2;
            local_78.original._M_dataplus._M_p = (pointer)paVar12;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,
                       "The block database contains a block which appears to be from the future. This may be due to your computer\'s date and time being set incorrectly. Only rebuild the block database if you are sure that your computer\'s date and time are correct"
                       ,"");
            paVar2 = &local_78.translated.field_2;
            if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0)
            {
              local_78.translated._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_78.translated,
                         "The block database contains a block which appears to be from the future. This may be due to your computer\'s date and time being set incorrectly. Only rebuild the block database if you are sure that your computer\'s date and time are correct"
                         ,"");
            }
            else {
              local_90 = 
              "The block database contains a block which appears to be from the future. This may be due to your computer\'s date and time being set incorrectly. Only rebuild the block database if you are sure that your computer\'s date and time are correct"
              ;
              (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                        (&local_78.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,&local_90);
            }
            paVar1 = &(__return_storage_ptr__->
                      super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                      super__Tuple_impl<1UL,_bilingual_str>.
                      super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original.field_2;
            (__return_storage_ptr__->
            super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
            super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
            _M_head_impl.original._M_dataplus._M_p = (pointer)paVar1;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78.original._M_dataplus._M_p == paVar12) {
              paVar1->_M_allocated_capacity =
                   CONCAT71(local_78.original.field_2._M_allocated_capacity._1_7_,
                            local_78.original.field_2._M_local_buf[0]);
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->
                       super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                       super__Tuple_impl<1UL,_bilingual_str>.
                       super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original.field_2 + 8
               ) = local_78.original.field_2._8_8_;
            }
            else {
              (__return_storage_ptr__->
              super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
              super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
              _M_head_impl.original._M_dataplus._M_p = local_78.original._M_dataplus._M_p;
              (__return_storage_ptr__->
              super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
              super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
              _M_head_impl.original.field_2._M_allocated_capacity =
                   CONCAT71(local_78.original.field_2._M_allocated_capacity._1_7_,
                            local_78.original.field_2._M_local_buf[0]);
            }
            (__return_storage_ptr__->
            super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
            super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
            _M_head_impl.original._M_string_length = local_78.original._M_string_length;
            paVar12 = &(__return_storage_ptr__->
                       super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                       super__Tuple_impl<1UL,_bilingual_str>.
                       super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.translated.field_2;
            (__return_storage_ptr__->
            super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
            super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
            _M_head_impl.translated._M_dataplus._M_p = (pointer)paVar12;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78.translated._M_dataplus._M_p == paVar2) {
              paVar12->_M_allocated_capacity =
                   CONCAT71(local_78.translated.field_2._M_allocated_capacity._1_7_,
                            local_78.translated.field_2._M_local_buf[0]);
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->
                       super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                       super__Tuple_impl<1UL,_bilingual_str>.
                       super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.translated.field_2 +
               8) = local_78.translated.field_2._8_8_;
            }
            else {
              (__return_storage_ptr__->
              super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
              super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
              _M_head_impl.translated._M_dataplus._M_p = local_78.translated._M_dataplus._M_p;
              (__return_storage_ptr__->
              super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
              super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
              _M_head_impl.translated.field_2._M_allocated_capacity =
                   CONCAT71(local_78.translated.field_2._M_allocated_capacity._1_7_,
                            local_78.translated.field_2._M_local_buf[0]);
            }
            (__return_storage_ptr__->
            super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
            super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
            _M_head_impl.translated._M_string_length = local_78.translated._M_string_length;
LAB_009385ed:
            (__return_storage_ptr__->
            super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
            super__Head_base<0UL,_node::ChainstateLoadStatus,_false>._M_head_impl = FAILURE;
LAB_00938737:
            local_78.translated._M_dataplus._M_p = (pointer)&local_78.translated.field_2;
            local_78.original._M_dataplus._M_p = (pointer)&local_78.original.field_2;
            local_78.translated.field_2._M_local_buf[0] = '\0';
            local_78.translated._M_string_length = 0;
            local_78.original.field_2._M_local_buf[0] = '\0';
            local_78.original._M_string_length = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                   super__Vector_impl_data._M_start ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) goto LAB_00938765;
            uVar11 = (long)local_a8.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage -
                     (long)local_a8.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                           _M_impl.super__Vector_impl_data._M_start;
            goto LAB_00938760;
          }
          CVerifyDB::CVerifyDB((CVerifyDB *)&local_78,(chainman->m_options).notifications);
          consensus_params = (chainman->m_options).chainparams;
          puVar10 = inline_assertion_check<true,std::unique_ptr<CoinsViews,std::default_delete<CoinsViews>>&>
                              (&this->m_coins_views,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.h"
                               ,0x271,"CoinsDB","m_coins_views");
          VVar5 = CVerifyDB::VerifyDB((CVerifyDB *)&local_78,this,&consensus_params->consensus,
                                      (CCoinsView *)
                                      (puVar10->_M_t).
                                      super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>
                                      .super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl,
                                      (int)options->check_level,(int)options->check_blocks);
          CVerifyDB::~CVerifyDB((CVerifyDB *)&local_78);
          if (VVar5 == SKIPPED_L3_CHECKS) {
            if (options->require_full_verification == true) {
              paVar12 = &local_78.original.field_2;
              local_78.original._M_dataplus._M_p = (pointer)paVar12;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_78,"Insufficient dbcache for block verification","");
              if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0
                 ) {
                local_78.translated._M_dataplus._M_p = (pointer)&local_78.translated.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_78.translated,
                           "Insufficient dbcache for block verification","");
              }
              else {
                local_90 = "Insufficient dbcache for block verification";
                (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                          (&local_78.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,&local_90
                          );
              }
              paVar2 = &(__return_storage_ptr__->
                        super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                        super__Tuple_impl<1UL,_bilingual_str>.
                        super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original.field_2;
              (__return_storage_ptr__->
              super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
              super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
              _M_head_impl.original._M_dataplus._M_p = (pointer)paVar2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78.original._M_dataplus._M_p == paVar12) {
                paVar2->_M_allocated_capacity =
                     CONCAT71(local_78.original.field_2._M_allocated_capacity._1_7_,
                              local_78.original.field_2._M_local_buf[0]);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->
                         super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                         super__Tuple_impl<1UL,_bilingual_str>.
                         super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original.field_2 +
                 8) = local_78.original.field_2._8_8_;
              }
              else {
                (__return_storage_ptr__->
                super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                _M_head_impl.original._M_dataplus._M_p = local_78.original._M_dataplus._M_p;
                (__return_storage_ptr__->
                super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                _M_head_impl.original.field_2._M_allocated_capacity =
                     CONCAT71(local_78.original.field_2._M_allocated_capacity._1_7_,
                              local_78.original.field_2._M_local_buf[0]);
              }
              (__return_storage_ptr__->
              super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
              super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
              _M_head_impl.original._M_string_length = local_78.original._M_string_length;
              paVar12 = &(__return_storage_ptr__->
                         super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                         super__Tuple_impl<1UL,_bilingual_str>.
                         super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.translated.field_2
              ;
              (__return_storage_ptr__->
              super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
              super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
              _M_head_impl.translated._M_dataplus._M_p = (pointer)paVar12;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78.translated._M_dataplus._M_p == &local_78.translated.field_2) {
                paVar12->_M_allocated_capacity =
                     CONCAT71(local_78.translated.field_2._M_allocated_capacity._1_7_,
                              local_78.translated.field_2._M_local_buf[0]);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->
                         super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                         super__Tuple_impl<1UL,_bilingual_str>.
                         super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.translated.field_2
                 + 8) = local_78.translated.field_2._8_8_;
              }
              else {
                (__return_storage_ptr__->
                super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                _M_head_impl.translated._M_dataplus._M_p = local_78.translated._M_dataplus._M_p;
                (__return_storage_ptr__->
                super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                _M_head_impl.translated.field_2._M_allocated_capacity =
                     CONCAT71(local_78.translated.field_2._M_allocated_capacity._1_7_,
                              local_78.translated.field_2._M_local_buf[0]);
              }
              (__return_storage_ptr__->
              super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
              super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
              _M_head_impl.translated._M_string_length = local_78.translated._M_string_length;
              (__return_storage_ptr__->
              super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
              super__Head_base<0UL,_node::ChainstateLoadStatus,_false>._M_head_impl =
                   FAILURE_INSUFFICIENT_DBCACHE;
              goto LAB_00938737;
            }
          }
          else {
            if (VVar5 == CORRUPTED_BLOCK_DB) {
              paVar12 = &local_78.original.field_2;
              local_78.original._M_dataplus._M_p = (pointer)paVar12;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_78,"Corrupted block database detected","");
              if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0
                 ) {
                local_78.translated._M_dataplus._M_p = (pointer)&local_78.translated.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_78.translated,"Corrupted block database detected","");
              }
              else {
                local_90 = "Corrupted block database detected";
                (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                          (&local_78.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,&local_90
                          );
              }
              paVar2 = &(__return_storage_ptr__->
                        super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                        super__Tuple_impl<1UL,_bilingual_str>.
                        super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original.field_2;
              (__return_storage_ptr__->
              super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
              super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
              _M_head_impl.original._M_dataplus._M_p = (pointer)paVar2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78.original._M_dataplus._M_p == paVar12) {
                paVar2->_M_allocated_capacity =
                     CONCAT71(local_78.original.field_2._M_allocated_capacity._1_7_,
                              local_78.original.field_2._M_local_buf[0]);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->
                         super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                         super__Tuple_impl<1UL,_bilingual_str>.
                         super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original.field_2 +
                 8) = local_78.original.field_2._8_8_;
              }
              else {
                (__return_storage_ptr__->
                super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                _M_head_impl.original._M_dataplus._M_p = local_78.original._M_dataplus._M_p;
                (__return_storage_ptr__->
                super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                _M_head_impl.original.field_2._M_allocated_capacity =
                     CONCAT71(local_78.original.field_2._M_allocated_capacity._1_7_,
                              local_78.original.field_2._M_local_buf[0]);
              }
              (__return_storage_ptr__->
              super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
              super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
              _M_head_impl.original._M_string_length = local_78.original._M_string_length;
              paVar12 = &(__return_storage_ptr__->
                         super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                         super__Tuple_impl<1UL,_bilingual_str>.
                         super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.translated.field_2
              ;
              (__return_storage_ptr__->
              super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
              super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
              _M_head_impl.translated._M_dataplus._M_p = (pointer)paVar12;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78.translated._M_dataplus._M_p == &local_78.translated.field_2) {
                paVar12->_M_allocated_capacity =
                     CONCAT71(local_78.translated.field_2._M_allocated_capacity._1_7_,
                              local_78.translated.field_2._M_local_buf[0]);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->
                         super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                         super__Tuple_impl<1UL,_bilingual_str>.
                         super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.translated.field_2
                 + 8) = local_78.translated.field_2._8_8_;
              }
              else {
                (__return_storage_ptr__->
                super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                _M_head_impl.translated._M_dataplus._M_p = local_78.translated._M_dataplus._M_p;
                (__return_storage_ptr__->
                super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                _M_head_impl.translated.field_2._M_allocated_capacity =
                     CONCAT71(local_78.translated.field_2._M_allocated_capacity._1_7_,
                              local_78.translated.field_2._M_local_buf[0]);
              }
              (__return_storage_ptr__->
              super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
              super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
              _M_head_impl.translated._M_string_length = local_78.translated._M_string_length;
              goto LAB_009385ed;
            }
            if (VVar5 == INTERRUPTED) {
              paVar12 = &local_78.original.field_2;
              local_78.original._M_dataplus._M_p = (pointer)paVar12;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_78,"Block verification was interrupted","");
              if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0
                 ) {
                local_78.translated._M_dataplus._M_p = (pointer)&local_78.translated.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_78.translated,"Block verification was interrupted","");
              }
              else {
                local_90 = "Block verification was interrupted";
                (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                          (&local_78.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,&local_90
                          );
              }
              paVar2 = &(__return_storage_ptr__->
                        super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                        super__Tuple_impl<1UL,_bilingual_str>.
                        super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original.field_2;
              (__return_storage_ptr__->
              super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
              super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
              _M_head_impl.original._M_dataplus._M_p = (pointer)paVar2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78.original._M_dataplus._M_p == paVar12) {
                paVar2->_M_allocated_capacity =
                     CONCAT71(local_78.original.field_2._M_allocated_capacity._1_7_,
                              local_78.original.field_2._M_local_buf[0]);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->
                         super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                         super__Tuple_impl<1UL,_bilingual_str>.
                         super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original.field_2 +
                 8) = local_78.original.field_2._8_8_;
              }
              else {
                (__return_storage_ptr__->
                super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                _M_head_impl.original._M_dataplus._M_p = local_78.original._M_dataplus._M_p;
                (__return_storage_ptr__->
                super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                _M_head_impl.original.field_2._M_allocated_capacity =
                     CONCAT71(local_78.original.field_2._M_allocated_capacity._1_7_,
                              local_78.original.field_2._M_local_buf[0]);
              }
              (__return_storage_ptr__->
              super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
              super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
              _M_head_impl.original._M_string_length = local_78.original._M_string_length;
              paVar12 = &(__return_storage_ptr__->
                         super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                         super__Tuple_impl<1UL,_bilingual_str>.
                         super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.translated.field_2
              ;
              (__return_storage_ptr__->
              super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
              super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
              _M_head_impl.translated._M_dataplus._M_p = (pointer)paVar12;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78.translated._M_dataplus._M_p == &local_78.translated.field_2) {
                paVar12->_M_allocated_capacity =
                     CONCAT71(local_78.translated.field_2._M_allocated_capacity._1_7_,
                              local_78.translated.field_2._M_local_buf[0]);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->
                         super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                         super__Tuple_impl<1UL,_bilingual_str>.
                         super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.translated.field_2
                 + 8) = local_78.translated.field_2._8_8_;
              }
              else {
                (__return_storage_ptr__->
                super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                _M_head_impl.translated._M_dataplus._M_p = local_78.translated._M_dataplus._M_p;
                (__return_storage_ptr__->
                super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
                super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
                _M_head_impl.translated.field_2._M_allocated_capacity =
                     CONCAT71(local_78.translated.field_2._M_allocated_capacity._1_7_,
                              local_78.translated.field_2._M_local_buf[0]);
              }
              (__return_storage_ptr__->
              super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
              super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
              _M_head_impl.translated._M_string_length = local_78.translated._M_string_length;
              (__return_storage_ptr__->
              super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
              super__Head_base<0UL,_node::ChainstateLoadStatus,_false>._M_head_impl = INTERRUPTED;
              goto LAB_00938737;
            }
          }
        }
      }
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar12->_M_allocated_capacity + 1);
    } while (paVar12 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_a8.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                super__Vector_impl_data._M_finish);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
         super__Vector_impl_data._M_start !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_a8.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  paVar12 = &local_78.original.field_2;
  local_78.original._M_string_length = 0;
  local_78.original.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_78.translated.field_2;
  local_78.translated._M_string_length = 0;
  local_78.translated.field_2._M_local_buf[0] = '\0';
  local_78.original._M_dataplus._M_p = (pointer)paVar12;
  local_78.translated._M_dataplus._M_p = (pointer)paVar2;
  std::_Head_base<1UL,_bilingual_str,_false>::_Head_base
            ((_Head_base<1UL,_bilingual_str,_false> *)__return_storage_ptr__,&local_78);
  (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
  super__Head_base<0UL,_node::ChainstateLoadStatus,_false>._M_head_impl = SUCCESS;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.translated._M_dataplus._M_p != paVar2) {
    operator_delete(local_78.translated._M_dataplus._M_p,
                    CONCAT71(local_78.translated.field_2._M_allocated_capacity._1_7_,
                             local_78.translated.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.original._M_dataplus._M_p != paVar12) {
    uVar11 = CONCAT71(local_78.original.field_2._M_allocated_capacity._1_7_,
                      local_78.original.field_2._M_local_buf[0]) + 1;
    local_a8.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_78.original._M_dataplus._M_p;
LAB_00938760:
    operator_delete(local_a8.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl
                    .super__Vector_impl_data._M_start,uVar11);
  }
LAB_00938765:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

ChainstateLoadResult VerifyLoadedChainstate(ChainstateManager& chainman, const ChainstateLoadOptions& options)
{
    auto is_coinsview_empty = [&](Chainstate* chainstate) EXCLUSIVE_LOCKS_REQUIRED(::cs_main) {
        return options.wipe_chainstate_db || chainstate->CoinsTip().GetBestBlock().IsNull();
    };

    LOCK(cs_main);

    for (Chainstate* chainstate : chainman.GetAll()) {
        if (!is_coinsview_empty(chainstate)) {
            const CBlockIndex* tip = chainstate->m_chain.Tip();
            if (tip && tip->nTime > GetTime() + MAX_FUTURE_BLOCK_TIME) {
                return {ChainstateLoadStatus::FAILURE, _("The block database contains a block which appears to be from the future. "
                                                         "This may be due to your computer's date and time being set incorrectly. "
                                                         "Only rebuild the block database if you are sure that your computer's date and time are correct")};
            }

            VerifyDBResult result = CVerifyDB(chainman.GetNotifications()).VerifyDB(
                *chainstate, chainman.GetConsensus(), chainstate->CoinsDB(),
                options.check_level,
                options.check_blocks);
            switch (result) {
            case VerifyDBResult::SUCCESS:
            case VerifyDBResult::SKIPPED_MISSING_BLOCKS:
                break;
            case VerifyDBResult::INTERRUPTED:
                return {ChainstateLoadStatus::INTERRUPTED, _("Block verification was interrupted")};
            case VerifyDBResult::CORRUPTED_BLOCK_DB:
                return {ChainstateLoadStatus::FAILURE, _("Corrupted block database detected")};
            case VerifyDBResult::SKIPPED_L3_CHECKS:
                if (options.require_full_verification) {
                    return {ChainstateLoadStatus::FAILURE_INSUFFICIENT_DBCACHE, _("Insufficient dbcache for block verification")};
                }
                break;
            } // no default case, so the compiler can warn about missing cases
        }
    }

    return {ChainstateLoadStatus::SUCCESS, {}};
}